

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_unpack(char *infits,char *outfits,fpstate fpvar)

{
  char *__s;
  size_t sVar1;
  ushort **ppuVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  char hduname [513];
  char *hduloc;
  char *loc;
  int single;
  int extnum;
  int hdutype;
  int stat;
  fitsfile *outfptr;
  fitsfile *infptr;
  undefined4 in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  fitsfile *in_stack_fffffffffffff700;
  fitsfile *in_stack_fffffffffffff708;
  int in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  fitsfile *in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff720 [1704];
  fpstate fpvar_00;
  undefined1 auVar7 [1704];
  fpstate fVar8;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile **in_stack_ffffffffffffffb8;
  char *local_40;
  char *local_38;
  int local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  
  bVar6 = 0;
  fpvar_00._1688_16_ = in_stack_fffffffffffff720._1688_16_;
  fpvar_00._0_1680_ = in_stack_fffffffffffff720._0_1680_;
  fpvar_00._1680_8_ = &stack0x00000008;
  local_24 = 0;
  local_30 = 0;
  ffopentest(in_stack_fffffffffffff710,(fitsfile **)in_stack_fffffffffffff708,
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6fc,(int *)0x10a3e1);
  ffinit(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_24 != 0) {
    fp_abort_output(fpvar_00.prefix._356_8_,fpvar_00.prefix._348_8_,fpvar_00.prefix._344_4_);
  }
  if (*(char *)(fpvar_00._1680_8_ + 0x28d) != '\0') {
    __s = (char *)(fpvar_00._1680_8_ + 0x28d);
    local_38 = strchr(__s,0x2c);
    if (local_38 != (char *)0x0) {
      *local_38 = '\0';
    }
    strcpy(&stack0xfffffffffffffdb8,__s);
    if (local_38 == (char *)0x0) {
      sVar1 = strlen(&stack0xfffffffffffffdb8);
      local_40 = __s + sVar1;
      local_30 = 1;
    }
    else {
      local_40 = local_38 + 1;
    }
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)(char)fpvar_00.firstfile] & 0x800) == 0) {
      local_28 = 0;
      ffmnhd(fpvar_00._104_8_,fpvar_00.listonly,fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,
             fpvar_00.ntile[3]);
    }
    else {
      lVar3 = strtol(&stack0xfffffffffffffdb8,&local_38,10);
      local_2c = (undefined4)lVar3;
      if (*local_38 == '\0') {
        ffmahd(fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,fpvar_00.ntile[3],fpvar_00.ntile[2]);
        if (local_28 != 0) {
          local_24 = 0xe9;
        }
      }
      else {
        local_28 = 0;
        ffmnhd(fpvar_00._104_8_,fpvar_00.listonly,(char *)fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,
               fpvar_00.ntile[3]);
      }
    }
  }
  if (local_24 != 0) {
    fp_msg((char *)0x10a5ed);
    fp_msg((char *)0x10a5fa);
    fp_msg((char *)0x10a606);
    fp_abort_output(fpvar_00.prefix._356_8_,fpvar_00.prefix._348_8_,fpvar_00.prefix._344_4_);
  }
  while (local_24 == 0) {
    if (local_30 != 0) {
      local_24 = -1;
    }
    auVar7._1680_24_ = fpvar_00._1680_24_;
    auVar7._0_1672_ = fpvar_00._0_1672_;
    auVar7._1672_8_ = local_18;
    fVar8._1672_32_ = auVar7._1672_32_;
    fVar8._0_1664_ = fpvar_00._0_1664_;
    fVar8.outfile[0x1ec] = (undefined1)local_20;
    fVar8.outfile[0x1ed] = local_20._1_1_;
    fVar8.outfile[0x1ee] = local_20._2_1_;
    fVar8.outfile[0x1ef] = local_20._3_1_;
    fVar8.outfile[0x1f0] = local_20._4_1_;
    fVar8.outfile[0x1f1] = local_20._5_1_;
    fVar8.outfile[0x1f2] = local_20._6_1_;
    fVar8.outfile[499] = local_20._7_1_;
    puVar4 = fpvar_00._1680_8_;
    puVar5 = (undefined8 *)&stack0xfffffffffffff6f8;
    fpvar_00 = fVar8;
    for (lVar3 = 0xd5; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    fp_unpack_hdu(in_stack_fffffffffffff708,in_stack_fffffffffffff700,fpvar_00,
                  (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    if (*(int *)(fpvar_00._1680_8_ + 0x74) != 0) {
      ffpcks(fpvar_00.prefix._332_8_,fpvar_00.prefix._324_8_);
    }
    if (*(char *)(fpvar_00._1680_8_ + 0x28d) == '\0') {
      ffmrhd(in_stack_fffffffffffff718,in_stack_fffffffffffff714,
             &in_stack_fffffffffffff708->HDUposition,&in_stack_fffffffffffff700->HDUposition);
    }
    else if (*local_40 == '\0') {
      local_24 = 0x6b;
    }
    else {
      local_38 = strchr(local_40,0x2c);
      if (local_38 != (char *)0x0) {
        *local_38 = '\0';
      }
      strcpy(&stack0xfffffffffffffdb8,local_40);
      if (local_38 == (char *)0x0) {
        *local_40 = '\0';
      }
      else {
        local_40 = local_38 + 1;
      }
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(char)fpvar_00.firstfile] & 0x800) == 0) {
        local_28 = 0;
        ffmnhd(fpvar_00._104_8_,fpvar_00.listonly,fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,
               fpvar_00.ntile[3]);
      }
      else {
        lVar3 = strtol(&stack0xfffffffffffffdb8,&local_38,10);
        local_2c = (undefined4)lVar3;
        if (*local_38 == '\0') {
          ffmahd(fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,fpvar_00.ntile[3],fpvar_00.ntile[2]);
          if (local_28 != 0) {
            local_24 = 0xe9;
          }
        }
        else {
          local_28 = 0;
          ffmnhd(fpvar_00._104_8_,fpvar_00.listonly,(char *)fpvar_00.ntile[5],
                 fpvar_00.ntile[4]._4_4_,fpvar_00.ntile[3]);
        }
      }
      if (local_24 != 0) {
        fp_msg((char *)0x10a873);
        fp_msg((char *)0x10a880);
        fp_msg((char *)0x10a88c);
      }
    }
  }
  if (local_24 == 0x6b) {
    local_24 = 0;
  }
  if (*(int *)((long)fpvar_00._1680_8_ + 0x74) != 0) {
    ffmahd(fpvar_00.ntile[5],fpvar_00.ntile[4]._4_4_,fpvar_00.ntile[3],fpvar_00.ntile[2]);
    ffpcks(fpvar_00.prefix._332_8_,fpvar_00.prefix._324_8_);
  }
  if (local_24 != 0) {
    fp_abort_output(fpvar_00.prefix._356_8_,fpvar_00.prefix._348_8_,fpvar_00.prefix._344_4_);
  }
  ffclos(in_stack_fffffffffffff708,&in_stack_fffffffffffff700->HDUposition);
  ffclos(in_stack_fffffffffffff708,&in_stack_fffffffffffff700->HDUposition);
  return 0;
}

Assistant:

int fp_unpack (char *infits, char *outfits, fpstate fpvar)
{
        fitsfile *infptr, *outfptr;
        int stat=0, hdutype, extnum, single = 0;
	char *loc, *hduloc, hduname[SZ_STR];

        fits_open_file (&infptr, infits, READONLY, &stat);
        fits_create_file (&outfptr, outfits, &stat);

	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

        if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

            /* move to the first HDU in the list */
	    hduloc = fpvar.extname;
	    loc = strchr(hduloc, ','); /* look for 'comma' delimiter between names */
	    
	    if (loc)         
	        *loc = '\0';  /* terminate the first name in the string */

	    strcpy(hduname, hduloc);  /* copy the first name into temporary string */

	    if (loc)        
	        hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
            else {
	        hduloc += strlen(hduname);  /* end of the list */
	        single = 1;  /* only 1 HDU is being unpacked */
            }

            if (isdigit( (int) hduname[0]) ) {
	       extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

               /* check for junk following the integer */
               if (*loc == '\0' )  /* no junk, so move to this HDU number (+1) */
               {	       
                  fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                  if (hdutype != IMAGE_HDU)
		     stat = NOT_IMAGE;

               } else {  /* the string is not an integer, so must be the column name */
	          hdutype = IMAGE_HDU;
	          fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	       }
            }
	    else
	    {
                /* move to the named image extension */
  	        hdutype = IMAGE_HDU;
	        fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
            }
        }

        if (stat) {
	  fp_msg ("Unable to find and move to extension '");
          fp_msg(hduname);
	  fp_msg("'\n");
	  fp_abort_output(infptr, outfptr, stat);
        }

        while (! stat) {
	
	    if (single)
	        stat = -1;  /* special status flag to force output primary array */

            fp_unpack_hdu (infptr, outfptr, fpvar, &stat);

	    if (fpvar.do_checksums) {
	        fits_write_chksum (outfptr, &stat);
	    }

	    /* move to the next HDU */
            if (fpvar.extname[0]) {  /* unpack a list of HDUs? */

                if (!(*hduloc)) {
		    stat = END_OF_FILE;  /* we reached the end of the list */
		} else {
		    /* parse the next HDU name and move to it */
	            loc = strchr(hduloc, ',');
	    
	            if (loc)         /* look for 'comma' delimiter between names */
	               *loc = '\0';  /* terminate the first name in the string */

	            strcpy(hduname, hduloc);  /* copy the next name into temporary string */

	            if (loc)         
	                hduloc = loc + 1;  /* advance to the beginning of the next name, if any */
                    else
	               *hduloc = '\0';  /* end of the list */

                    if (isdigit( (int) hduname[0]) ) {
	               extnum = strtol(hduname, &loc, 10); /* read the string as an integer */

                      /* check for junk following the integer */
                      if (*loc == '\0' )   /* no junk, so move to this HDU number (+1) */
		      {	       
                        fits_movabs_hdu(infptr, extnum + 1, &hdutype, &stat);  /* move to HDU number */
                        if (hdutype != IMAGE_HDU)
		        stat = NOT_IMAGE;

                      } else {  /* the string is not an integer, so must be the column name */
	                hdutype = IMAGE_HDU;
	                fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
 	              }

                    } else {
                      /* move to the named image extension */
  	              hdutype = IMAGE_HDU;
	              fits_movnam_hdu(infptr, hdutype, hduname, 0, &stat);
                   }

                   if (stat) {
	              fp_msg ("Unable to find and move to extension '");
                      fp_msg(hduname);
	              fp_msg("'\n");
                   }
                }
            } else {
                /* increment to the next HDU */
                fits_movrel_hdu (infptr, 1, NULL, &stat);
            }
        }

        if (stat == END_OF_FILE) stat = 0;

        /* set checksum for case of newly created primary HDU
         */
	if (fpvar.do_checksums) {
	    fits_movabs_hdu (outfptr, 1, NULL, &stat);
	    fits_write_chksum (outfptr, &stat);
	}


	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	fits_close_file (outfptr, &stat);
	fits_close_file (infptr, &stat);

	return(0);
}